

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Unmap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  while (iVar4 = Extra_UtilGetopt(argc,argv,"vh"), iVar4 == 0x76) {
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (iVar4 == -1) {
    pGVar1 = pAbc->pGia;
    if (pGVar1 != (Gia_Man_t *)0x0) {
      if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
        piVar2 = pGVar1->vMapping->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pGVar1->vMapping->pArray = (int *)0x0;
        }
        if (pGVar1->vMapping != (Vec_Int_t *)0x0) {
          free(pGVar1->vMapping);
          pGVar1->vMapping = (Vec_Int_t *)0x0;
        }
      }
      pGVar1 = pAbc->pGia;
      if (pGVar1->vPacking != (Vec_Int_t *)0x0) {
        piVar2 = pGVar1->vPacking->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pGVar1->vPacking->pArray = (int *)0x0;
        }
        if (pGVar1->vPacking != (Vec_Int_t *)0x0) {
          free(pGVar1->vPacking);
          pGVar1->vPacking = (Vec_Int_t *)0x0;
        }
      }
      pGVar1 = pAbc->pGia;
      if (pGVar1->vCellMapping != (Vec_Int_t *)0x0) {
        piVar2 = pGVar1->vCellMapping->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pGVar1->vCellMapping->pArray = (int *)0x0;
        }
        if (pGVar1->vCellMapping != (Vec_Int_t *)0x0) {
          free(pGVar1->vCellMapping);
          pGVar1->vCellMapping = (Vec_Int_t *)0x0;
        }
      }
      pGVar1 = pAbc->pGia;
      if (pGVar1->vEdge1 != (Vec_Int_t *)0x0) {
        piVar2 = pGVar1->vEdge1->pArray;
        if (piVar2 != (int *)0x0) {
          free(piVar2);
          pGVar1->vEdge1->pArray = (int *)0x0;
        }
        if (pGVar1->vEdge1 != (Vec_Int_t *)0x0) {
          free(pGVar1->vEdge1);
          pGVar1->vEdge1 = (Vec_Int_t *)0x0;
        }
      }
      pGVar1 = pAbc->pGia;
      if (pGVar1->vEdge2 == (Vec_Int_t *)0x0) {
        return 0;
      }
      piVar2 = pGVar1->vEdge2->pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pGVar1->vEdge2->pArray = (int *)0x0;
      }
      if (pGVar1->vEdge2 == (Vec_Int_t *)0x0) {
        return 0;
      }
      free(pGVar1->vEdge2);
      pGVar1->vEdge2 = (Vec_Int_t *)0x0;
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9Struct(): There is no AIG to map.\n";
    iVar4 = -1;
  }
  else {
    Abc_Print(-2,"usage: &unmap [-vh]\n");
    Abc_Print(-2,"\t           removes mapping from the current network\n");
    pcVar5 = "yes";
    if (!bVar3) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
    pcVar5 = "\t-h       : print the command usage\n";
    iVar4 = -2;
  }
  Abc_Print(iVar4,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9Unmap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManTestStruct( Gia_Man_t * p );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Struct(): There is no AIG to map.\n" );
        return 1;
    }
    Vec_IntFreeP( &pAbc->pGia->vMapping );
    Vec_IntFreeP( &pAbc->pGia->vPacking );
    Vec_IntFreeP( &pAbc->pGia->vCellMapping );
    Vec_IntFreeP( &pAbc->pGia->vEdge1 );
    Vec_IntFreeP( &pAbc->pGia->vEdge2 );
    return 0;

usage:
    Abc_Print( -2, "usage: &unmap [-vh]\n" );
    Abc_Print( -2, "\t           removes mapping from the current network\n" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}